

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

double __thiscall
BayesianGameForDecPOMDPStage::ComputeDiscountedImmediateRewardForJPol
          (BayesianGameForDecPOMDPStage *this,shared_ptr<JointPolicyDiscretePure> *jpolBG,
          PlanningUnitFactoredDecPOMDPDiscrete *pu)

{
  undefined1 auVar1 [16];
  DecPOMDPDiscreteInterface *pDVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  double local_40;
  
  sVar4 = BayesianGameBase::GetNrJointTypes
                    ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  if (sVar4 == 0) {
    local_40 = 0.0;
  }
  else {
    uVar5 = 0;
    auVar8 = ZEXT1664(ZEXT816(0));
    local_40 = 0.0;
    do {
      uVar3 = (*(jpolBG->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                super_JointPolicy._vptr_JointPolicy[0x11])(jpolBG->px,uVar5);
      (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
        super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0xd])
                (&this->super_BayesianGameIdenticalPayoff,uVar5);
      uVar6 = auVar8._0_8_;
      (*(this->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[2])(this,uVar5,(ulong)uVar3,0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_40;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      auVar1 = vfmadd231sd_fma(auVar9,auVar8._0_16_,auVar1);
      local_40 = auVar1._0_8_;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < sVar4);
  }
  pDVar2 = this->_m_pu->_m_DecPOMDP;
  dVar7 = (double)(**(code **)(*(long *)((long)&pDVar2->field_0x0 +
                                        *(long *)(*(long *)pDVar2 + -0xb0)) + 0x70))
                            ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  auVar1 = vcvtusi2sd_avx512f(in_XMM2,(this->super_BayesianGameForDecPOMDPStageInterface)._m_t);
  dVar7 = pow(dVar7,auVar1._0_8_);
  return dVar7 * local_40;
}

Assistant:

double BayesianGameForDecPOMDPStage::
ComputeDiscountedImmediateRewardForJPol(const boost::shared_ptr<JointPolicyDiscretePure> &jpolBG,
                                        const PlanningUnitFactoredDecPOMDPDiscrete *pu) const
{
    //eval the expected future payoff of this jpolBG
    double r = 0.0; //immediate reward (exact)
    size_t nrJT = this->GetNrJointTypes();
    for(Index jt = 0; jt < nrJT ; jt++)
    {
        Index jaI = jpolBG->GetJointActionIndex(jt);
        double jt_prob = this->GetProbability(jt);
        double jt_r = this->GetImmediateReward(jt, jaI);
        r += jt_prob * jt_r;
    }
    double discount = _m_pu->GetDiscount();
    double discT = pow(discount , (double)(GetStage()) );
    double discounted_r = discT * r;
    return discounted_r;    
}